

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

pointer __thiscall
slang::SmallVectorBase<slang::SourceRange>::
emplaceRealloc<slang::SourceLocation&,slang::SourceLocation&>
          (SmallVectorBase<slang::SourceRange> *this,pointer pos,SourceLocation *args,
          SourceLocation *args_1)

{
  ulong uVar1;
  SourceLocation SVar2;
  pointer p;
  pointer pSVar3;
  pointer pSVar4;
  pointer pSVar5;
  long lVar6;
  ulong uVar7;
  size_type sVar8;
  long lVar9;
  
  if (this->len == 0x7ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar7 = this->len + 1;
  uVar1 = this->cap;
  if (uVar7 < uVar1 * 2) {
    uVar7 = uVar1 * 2;
  }
  if (0x7ffffffffffffff - uVar1 < uVar1) {
    uVar7 = 0x7ffffffffffffff;
  }
  lVar9 = (long)pos - (long)this->data_;
  pSVar3 = (pointer)operator_new(uVar7 << 4);
  SVar2 = *args_1;
  *(SourceLocation *)((long)pSVar3 + lVar9) = *args;
  *(SourceLocation *)((long)pSVar3 + lVar9 + 8) = SVar2;
  p = this->data_;
  sVar8 = this->len;
  lVar6 = (long)p + (sVar8 * 0x10 - (long)pos);
  pSVar4 = p;
  pSVar5 = pSVar3;
  if (lVar6 == 0) {
    pSVar4 = pSVar3;
    pSVar5 = p;
    if (sVar8 != 0) {
      do {
        SVar2 = pSVar5->endLoc;
        pSVar4->startLoc = pSVar5->startLoc;
        pSVar4->endLoc = SVar2;
        pSVar5 = pSVar5 + 1;
        pSVar4 = pSVar4 + 1;
      } while (pSVar5 != pos);
    }
  }
  else {
    for (; pSVar4 != pos; pSVar4 = pSVar4 + 1) {
      SVar2 = pSVar4->endLoc;
      pSVar5->startLoc = pSVar4->startLoc;
      pSVar5->endLoc = SVar2;
      pSVar5 = pSVar5 + 1;
    }
    memcpy((void *)((long)pSVar3 + lVar9 + 0x10),pos,(lVar6 - 0x10U & 0xfffffffffffffff0) + 0x10);
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
    sVar8 = this->len;
  }
  this->len = sVar8 + 1;
  this->cap = uVar7;
  this->data_ = pSVar3;
  return (pointer)((long)pSVar3 + lVar9);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}